

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.h
# Opt level: O3

void print_number(int64_t x)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar8;
  int iVar9;
  long lVar10;
  char buffer [30];
  byte local_38 [28];
  undefined1 local_1c;
  undefined1 local_1b;
  uint uVar7;
  
  uVar3 = -x;
  if (0 < x) {
    uVar3 = x;
  }
  iVar8 = 0;
  if (uVar3 - 1 < 99999999) {
    uVar4 = uVar3;
    uVar6 = 0xffffffff;
    do {
      uVar7 = uVar6;
      uVar6 = uVar7 + 1;
      if (0x5f5e0fe < uVar4 * 10 - 1) break;
      uVar4 = uVar4 * 10;
    } while (uVar6 < 5);
    if (uVar6 < 5) {
      iVar8 = uVar7 + 2;
      goto LAB_0012fd92;
    }
    iVar8 = 6;
  }
  else {
LAB_0012fd92:
    iVar9 = 6;
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 / 10;
      iVar9 = iVar9 + -1;
    } while (iVar8 != iVar9);
    uVar3 = (uVar3 + 1) - (ulong)(uVar4 % 10 < 5);
    if (iVar8 == 0) {
      local_1c = 0x30;
      lVar10 = 0x1b;
      goto LAB_0012fe16;
    }
  }
  lVar10 = 0x1c;
  uVar4 = uVar3;
  do {
    uVar3 = uVar4 / 10;
    local_38[lVar10] = (char)uVar4 + (char)uVar3 * -10 | 0x30;
    lVar10 = lVar10 + -1;
    iVar8 = iVar8 + -1;
    uVar4 = uVar3;
  } while (iVar8 != 0);
LAB_0012fe16:
  local_1b = 0;
  local_38[lVar10] = 0x2e;
  uVar4 = 0;
  pbVar2 = local_38;
  do {
    pbVar5 = pbVar2;
    pbVar5[lVar10 + -1] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    uVar4 = uVar4 + 1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
    pbVar2 = pbVar5 + -1;
  } while (bVar1);
  if (x < 0) {
    pbVar5[lVar10 + -2] = 0x2d;
    lVar10 = (lVar10 + -1) - uVar4;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  else {
    lVar10 = lVar10 - uVar4;
  }
  printf("%5.*s",uVar4 & 0xffffffff,local_38 + lVar10);
  printf("%-*s",6,local_38 + (int)uVar4 + lVar10);
  return;
}

Assistant:

static void print_number(const int64_t x) {
    int64_t x_abs, y;
    int c, i, rounding, g; /* g = integer part size, c = fractional part size */
    size_t ptr;
    char buffer[30];

    if (x == INT64_MIN) {
        /* Prevent UB. */
        printf("ERR");
        return;
    }
    x_abs = x < 0 ? -x : x;

    /* Determine how many decimals we want to show (more than FP_EXP makes no
     * sense). */
    y = x_abs;
    c = 0;
    while (y > 0LL && y < 100LL * FP_MULT && c < FP_EXP) {
        y *= 10LL;
        c++;
    }

    /* Round to 'c' decimals. */
    y = x_abs;
    rounding = 0;
    for (i = c; i < FP_EXP; ++i) {
        rounding = (y % 10) >= 5;
        y /= 10;
    }
    y += rounding;

    /* Format and print the number. */
    ptr = sizeof(buffer) - 1;
    buffer[ptr] = 0;
    g = 0;
    if (c != 0) { /* non zero fractional part */
        for (i = 0; i < c; ++i) {
            buffer[--ptr] = '0' + (y % 10);
            y /= 10;
        }
    } else if (c == 0) { /* fractional part is 0 */
        buffer[--ptr] = '0'; 
    }
    buffer[--ptr] = '.';
    do {
        buffer[--ptr] = '0' + (y % 10);
        y /= 10;
        g++;
    } while (y != 0);
    if (x < 0) {
        buffer[--ptr] = '-';
        g++;
    }
    printf("%5.*s", g, &buffer[ptr]); /* Prints integer part */
    printf("%-*s", FP_EXP, &buffer[ptr + g]); /* Prints fractional part */
}